

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nsync_semaphore_futex.c
# Opt level: O1

int nsync_mu_semaphore_p_with_deadline(nsync_semaphore *s,nsync_time abs_deadline)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  __time_t *p_Var6;
  bool bVar7;
  nsync_time nVar8;
  timespec ts_buf;
  __time_t local_58;
  __syscall_slong_t _Stack_50;
  __syscall_slong_t local_40;
  __time_t local_38;
  
  local_38 = 0x7fffffffffffffff;
  local_40 = 999999999;
  while( true ) {
    iVar1 = *(int *)s->sem_space;
    iVar2 = 0;
    if (iVar1 == 0) {
      nVar8.tv_nsec = local_40;
      nVar8.tv_sec = local_38;
      iVar2 = nsync_time_cmp(abs_deadline,nVar8);
      if (iVar2 == 0) {
        p_Var6 = (__time_t *)0x0;
      }
      else {
        p_Var6 = &local_58;
        local_58 = abs_deadline.tv_sec;
        _Stack_50 = abs_deadline.tv_nsec;
      }
      iVar2 = 0;
      lVar4 = syscall(0xca,s,0x189,0,p_Var6,0,0xffffffff);
      if ((int)lVar4 != 0) {
        piVar5 = __errno_location();
        iVar3 = *piVar5;
        if (((iVar3 != 4) && (iVar3 != 0xb)) && (iVar3 != 0x6e)) {
          _DAT_00000000 = 0;
        }
        if (iVar3 == 0x6e && (int)lVar4 == -1) {
          nVar8 = nsync_time_now();
          iVar3 = nsync_time_cmp(abs_deadline,nVar8);
          iVar2 = 0;
          if (iVar3 < 1) {
            iVar2 = 0x6e;
          }
        }
      }
    }
    if (iVar2 != 0) break;
    if (iVar1 != 0) {
      LOCK();
      bVar7 = iVar1 == *(int *)s->sem_space;
      if (bVar7) {
        *(int *)s->sem_space = iVar1 + -1;
      }
      UNLOCK();
      if (bVar7) {
        return 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int nsync_mu_semaphore_p_with_deadline (nsync_semaphore *s, nsync_time abs_deadline) {
	struct futex *f = (struct futex *)s;
	int i;
	int result = 0;
	do {
		i = ATM_LOAD ((nsync_atomic_uint32_ *) &f->i);
		if (i == 0) {
			int futex_result;
			struct timespec ts_buf;
			const struct timespec *ts = NULL;
			if (nsync_time_cmp (abs_deadline, nsync_time_no_deadline) != 0) {
				memset (&ts_buf, 0, sizeof (ts_buf));
				if (FUTEX_TIMEOUT_IS_ABSOLUTE) {
					ts_buf.tv_sec = NSYNC_TIME_SEC (abs_deadline);
					ts_buf.tv_nsec = NSYNC_TIME_NSEC (abs_deadline);
				} else {
					nsync_time now;
					now = nsync_time_now ();
					if (nsync_time_cmp (now, abs_deadline) > 0) {
						ts_buf.tv_sec = 0;
						ts_buf.tv_nsec = 0;
					} else {
						nsync_time rel_deadline;
						rel_deadline = nsync_time_sub (abs_deadline, now);
						ts_buf.tv_sec = NSYNC_TIME_SEC (rel_deadline);
						ts_buf.tv_nsec = NSYNC_TIME_NSEC (rel_deadline);
					}
				}
				ts = &ts_buf;
			}
			futex_result = futex (&f->i, FUTEX_WAIT_, i, ts, NULL, FUTEX_WAIT_BITS_);
			ASSERT (futex_result == 0 || errno == EINTR || errno == EWOULDBLOCK ||
				errno == ETIMEDOUT);
			/* Some systems don't wait as long as they are told. */ 
			if (futex_result == -1 && errno == ETIMEDOUT &&
			    nsync_time_cmp (abs_deadline, nsync_time_now ()) <= 0) {
				result = ETIMEDOUT;
			}
		}
	} while (result == 0 && (i == 0 || !ATM_CAS_ACQ ((nsync_atomic_uint32_ *) &f->i, i, i - 1)));
	return (result);
}